

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O3

void AddGreenToBlueAndRed_SSE2(uint32_t *src,int num_pixels,uint32_t *dst)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  int num_pixels_00;
  ulong uVar4;
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  
  uVar3 = 0;
  if (3 < num_pixels) {
    uVar2 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(src + uVar2);
      auVar5 = pshuflw(in_XMM1,auVar1,0xa0);
      auVar5 = pshufhw(auVar5,auVar5,0xa0);
      in_XMM1[0] = auVar5[1] + auVar1[0];
      in_XMM1[1] = auVar1[1];
      in_XMM1[2] = auVar5[3] + auVar1[2];
      in_XMM1[3] = auVar1[3];
      in_XMM1[4] = auVar5[5] + auVar1[4];
      in_XMM1[5] = auVar1[5];
      in_XMM1[6] = auVar5[7] + auVar1[6];
      in_XMM1[7] = auVar1[7];
      in_XMM1[8] = auVar5[9] + auVar1[8];
      in_XMM1[9] = auVar1[9];
      in_XMM1[10] = auVar5[0xb] + auVar1[10];
      in_XMM1[0xb] = auVar1[0xb];
      in_XMM1[0xc] = auVar5[0xd] + auVar1[0xc];
      in_XMM1[0xd] = auVar1[0xd];
      in_XMM1[0xe] = auVar5[0xf] + auVar1[0xe];
      in_XMM1[0xf] = auVar1[0xf];
      *(undefined1 (*) [16])(dst + uVar2) = in_XMM1;
      uVar3 = uVar2 + 4;
      uVar4 = uVar2 + 8;
      uVar2 = uVar3;
    } while (uVar4 <= (uint)num_pixels);
  }
  num_pixels_00 = num_pixels - (int)uVar3;
  if (num_pixels_00 == 0) {
    return;
  }
  VP8LAddGreenToBlueAndRed_C(src + (uVar3 & 0xffffffff),num_pixels_00,dst + (uVar3 & 0xffffffff));
  return;
}

Assistant:

static void AddGreenToBlueAndRed_SSE2(const uint32_t* const src, int num_pixels,
                                      uint32_t* dst) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((const __m128i*)&src[i]); // argb
    const __m128i A = _mm_srli_epi16(in, 8);     // 0 a 0 g
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // 0g0g
    const __m128i out = _mm_add_epi8(in, C);
    _mm_storeu_si128((__m128i*)&dst[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LAddGreenToBlueAndRed_C(src + i, num_pixels - i, dst + i);
  }
}